

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O0

int get_adjacent_loc(char *prompt,char *emsg,xchar x,xchar y,coord *cc,schar *dz)

{
  int iVar1;
  char local_3c;
  char local_3b;
  char local_3a;
  char local_39;
  schar dy;
  schar dx;
  xchar new_y;
  schar *psStack_38;
  xchar new_x;
  schar *dz_local;
  coord *cc_local;
  xchar y_local;
  char *pcStack_20;
  xchar x_local;
  char *emsg_local;
  char *prompt_local;
  
  psStack_38 = dz;
  dz_local = &cc->x;
  cc_local._6_1_ = y;
  cc_local._7_1_ = x;
  pcStack_20 = emsg;
  emsg_local = prompt;
  iVar1 = getdir(prompt,&local_3b,&local_3c,dz);
  if (iVar1 == 0) {
    pline("Never mind.");
    prompt_local._4_4_ = 0;
  }
  else {
    local_39 = cc_local._7_1_ + local_3b;
    local_3a = cc_local._6_1_ + local_3c;
    if ((((dz_local == (schar *)0x0) || (local_39 < '\x01')) || ('O' < local_39)) ||
       ((local_3a < '\0' || ('\x14' < local_3a)))) {
      if (pcStack_20 != (char *)0x0) {
        pline(pcStack_20);
      }
      prompt_local._4_4_ = 0;
    }
    else {
      *dz_local = local_39;
      dz_local[1] = local_3a;
      prompt_local._4_4_ = 1;
    }
  }
  return prompt_local._4_4_;
}

Assistant:

int get_adjacent_loc(const char *prompt, const char *emsg, xchar x, xchar y,
		     coord *cc, schar *dz)
{
	xchar new_x, new_y;
	schar dx, dy;
	
	if (!getdir(prompt, &dx, &dy, dz)) {
		pline("Never mind.");
		return 0;
	}
	new_x = x + dx;
	new_y = y + dy;
	if (cc && isok(new_x, new_y)) {
		cc->x = new_x;
		cc->y = new_y;
	} else {
		if (emsg)
		    pline(emsg);
		return 0;
	}
	return 1;
}